

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libwebsockets.c
# Opt level: O2

int lws_check_byte_utf8(uchar state,uchar c)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  uchar s;
  undefined7 in_register_00000039;
  
  if ((int)CONCAT71(in_register_00000039,state) == 0) {
    iVar2 = 0;
    if ((char)c < '\0') {
      if ((byte)(c + 0xb) < 0xcd) {
        return -1;
      }
      iVar2 = 0x8c;
      if (0xdf < c) {
        uVar3 = (ulong)(c & 0x1f);
        goto LAB_0010e95f;
      }
    }
  }
  else {
    uVar1 = (uint)state;
    iVar2 = -1;
    if (((uVar1 & 0xf0) <= (uint)c) && ((uint)c < (uVar1 & 0xf0) + (uVar1 & 0xc) * 4 + 0x10)) {
      uVar3 = (ulong)((uVar1 & 3) + 0x15);
LAB_0010e95f:
      return (int)e0f4[uVar3];
    }
  }
  return iVar2;
}

Assistant:

int
lws_check_byte_utf8(unsigned char state, unsigned char c)
{
	unsigned char s = state;

	if (!s) {
		if (c >= 0x80) {
			if (c < 0xc2 || c > 0xf4)
				return -1;
			if (c < 0xe0)
				return 0x80 | ((4 - 1) << 2);
			else
				return e0f4[c - 0xe0];
		}

		return s;
	}
	if (c < (s & 0xf0) || c >= (s & 0xf0) + 0x10 + ((s << 2) & 0x30))
		return -1;

	return e0f4[21 + (s & 3)];
}